

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.cpp
# Opt level: O0

Spectrum __thiscall
CMU462::DiffuseBSDF::sample_f(DiffuseBSDF *this,Vector3D *wo,Vector3D *wi,float *pdf)

{
  undefined8 uVar1;
  Spectrum SVar2;
  float *in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  float fVar3;
  CosineWeightedHemisphereSampler3D *in_stack_ffffffffffffff98;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  CosineWeightedHemisphereSampler3D::get_sample(in_stack_ffffffffffffff98);
  in_RDX[2] = local_38;
  *in_RDX = local_48;
  in_RDX[1] = uStack_40;
  fVar3 = 3.3702806e+12;
  *in_RCX = (float)((double)in_RDX[2] / 3.141592653589793);
  uVar1 = (**(code **)*in_RDI)(in_RDI,in_RSI,in_RDX);
  SVar2.b = fVar3;
  SVar2.r = (float)(int)uVar1;
  SVar2.g = (float)(int)((ulong)uVar1 >> 0x20);
  return SVar2;
}

Assistant:

Spectrum DiffuseBSDF::sample_f(const Vector3D& wo, Vector3D* wi, float* pdf) {
	// TODO (PathTracer):
	// Implement DiffuseBSDF

	// use Cosine-Weighted sampling
	*wi = sampler.get_sample();
	*pdf = wi->z / PI; // wi->z = cos(theta)

	return f(wo,*wi);
}